

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O2

ScriptContext * __thiscall
TTD::ThreadContextTTD::LookupContextForScriptId(ThreadContextTTD *this,TTD_LOG_PTR_ID ctxId)

{
  ScriptContext **ppSVar1;
  int i;
  int index;
  
  index = 0;
  while( true ) {
    if ((this->m_contextList).
        super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>.count <=
        index) {
      return (ScriptContext *)0x0;
    }
    ppSVar1 = JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>::
              Item(&(this->m_contextList).
                    super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>,
                   index);
    if ((*ppSVar1)->ScriptContextLogTag == ctxId) break;
    index = index + 1;
  }
  ppSVar1 = JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>::Item
                      (&(this->m_contextList).
                        super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>
                       ,index);
  return *ppSVar1;
}

Assistant:

Js::ScriptContext* ThreadContextTTD::LookupContextForScriptId(TTD_LOG_PTR_ID ctxId) const
    {
        for(int i = 0; i < this->m_contextList.Count(); ++i)
        {
            if(this->m_contextList.Item(i)->ScriptContextLogTag == ctxId)
            {
                return this->m_contextList.Item(i);
            }
        }

        return nullptr;
    }